

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spolynomials.cpp
# Opt level: O0

void opengv::absolute_pose::modules::gp3p::sPolynomial30
               (Matrix<double,_48,_85,_0,_48,_85> *groebnerMatrix)

{
  double dVar1;
  double dVar2;
  Scalar *pSVar3;
  DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1> *this;
  Index in_stack_ffffffffffffff18;
  Scalar row;
  DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1> *in_stack_ffffffffffffff20;
  
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,0x8f6af6);
  row = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (in_stack_ffffffffffffff20,(Index)row,0x8f6b16);
  this = (DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1> *)(row / *pSVar3);
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8f6b3c);
  *pSVar3 = (Scalar)this;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8f6b5d);
  dVar1 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8f6b95);
  dVar2 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8f6bbc);
  *pSVar3 = -dVar1 / dVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8f6bdd);
  dVar1 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8f6bfe);
  dVar2 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8f6c25);
  *pSVar3 = dVar1 / dVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8f6c46);
  dVar1 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8f6c7e);
  dVar2 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8f6ca5);
  *pSVar3 = -dVar1 / dVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8f6cc6);
  dVar1 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8f6ce7);
  dVar2 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8f6d0e);
  *pSVar3 = dVar1 / dVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8f6d2f);
  dVar1 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8f6d67);
  dVar2 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8f6d8e);
  *pSVar3 = -dVar1 / dVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8f6daf);
  dVar1 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8f6dd0);
  dVar2 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8f6df7);
  *pSVar3 = dVar1 / dVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8f6e18);
  dVar1 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8f6e50);
  dVar2 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8f6e77);
  *pSVar3 = -dVar1 / dVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8f6e98);
  dVar1 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8f6ebc);
  dVar2 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8f6ee9);
  *pSVar3 = dVar1 / dVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8f6f0d);
  dVar1 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8f6f48);
  dVar2 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8f6f75);
  *pSVar3 = -dVar1 / dVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8f6f99);
  dVar1 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8f6fbd);
  dVar2 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8f6fea);
  *pSVar3 = dVar1 / dVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8f700e);
  dVar1 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8f7049);
  dVar2 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8f7076);
  *pSVar3 = -dVar1 / dVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8f709a);
  dVar1 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8f70be);
  dVar2 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8f70eb);
  *pSVar3 = dVar1 / dVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8f710f);
  dVar1 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8f714a);
  dVar2 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_1>::operator()
                     (this,(Index)row,0x8f7177);
  *pSVar3 = -dVar1 / dVar2;
  return;
}

Assistant:

void
opengv::absolute_pose::modules::gp3p::sPolynomial30( Eigen::Matrix<double,48,85> & groebnerMatrix )
{
  groebnerMatrix(30,43) = groebnerMatrix(17,75)/(groebnerMatrix(17,44));
  groebnerMatrix(30,44) = -groebnerMatrix(18,75)/(groebnerMatrix(18,43));
  groebnerMatrix(30,47) = groebnerMatrix(17,76)/(groebnerMatrix(17,44));
  groebnerMatrix(30,48) = -groebnerMatrix(18,76)/(groebnerMatrix(18,43));
  groebnerMatrix(30,52) = groebnerMatrix(17,77)/(groebnerMatrix(17,44));
  groebnerMatrix(30,53) = -groebnerMatrix(18,77)/(groebnerMatrix(18,43));
  groebnerMatrix(30,64) = groebnerMatrix(17,81)/(groebnerMatrix(17,44));
  groebnerMatrix(30,65) = -groebnerMatrix(18,81)/(groebnerMatrix(18,43));
  groebnerMatrix(30,68) = groebnerMatrix(17,82)/(groebnerMatrix(17,44));
  groebnerMatrix(30,69) = -groebnerMatrix(18,82)/(groebnerMatrix(18,43));
  groebnerMatrix(30,73) = groebnerMatrix(17,83)/(groebnerMatrix(17,44));
  groebnerMatrix(30,74) = -groebnerMatrix(18,83)/(groebnerMatrix(18,43));
  groebnerMatrix(30,79) = groebnerMatrix(17,84)/(groebnerMatrix(17,44));
  groebnerMatrix(30,80) = -groebnerMatrix(18,84)/(groebnerMatrix(18,43));
}